

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# protocol.cpp
# Opt level: O2

ssize_t __thiscall
chatter::Protocol::send(Protocol *this,int __fd,void *__buf,size_t __n,int __flags)

{
  SeqNum SVar1;
  Packet *this_00;
  Peer *this_01;
  element_type *peVar2;
  Host *this_02;
  bool bVar3;
  byte bVar4;
  uint16_t uVar5;
  ushort uVar6;
  ssize_t in_RAX;
  ssize_t extraout_RAX;
  ushort uVar7;
  undefined4 in_register_00000034;
  __shared_ptr<chatter::Packet,_(__gnu_cxx::_Lock_policy)2> *__x;
  __shared_ptr<chatter::Packet,_(__gnu_cxx::_Lock_policy)2> local_30;
  
  __x = (__shared_ptr<chatter::Packet,_(__gnu_cxx::_Lock_policy)2> *)
        CONCAT44(in_register_00000034,__fd);
  this_00 = __x->_M_ptr;
  if (this_00 != (Packet *)0x0) {
    this_01 = this_00->m_peer;
    bVar3 = Packet::has_flag(this_00,RELIABLE);
    if (bVar3) {
      bVar4 = Packet::get_channel(__x->_M_ptr);
      SVar1 = this_01->m_channels[bVar4].next_sequence;
      this_01->m_channels[bVar4].next_sequence = SVar1 + 1;
      __x->_M_ptr->m_sequence_num = SVar1;
      std::__cxx11::
      list<std::shared_ptr<chatter::Packet>,_std::allocator<std::shared_ptr<chatter::Packet>_>_>::
      push_back(&this_01->m_channels[bVar4].sent_reliable,(value_type *)__x);
    }
    uVar5 = Peer::get_rto(this_01);
    uVar7 = 3000;
    if (uVar5 < 3000) {
      uVar7 = uVar5;
    }
    uVar6 = 10;
    if (10 < uVar7) {
      uVar6 = uVar7;
    }
    peVar2 = __x->_M_ptr;
    peVar2->m_rto = uVar6;
    peVar2->m_send_queued = true;
    this_02 = this->m_host;
    std::__shared_ptr<chatter::Packet,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr(&local_30,__x);
    Host::queue_outgoing_packet(this_02,(ptr *)&local_30,SUB81(__buf,0));
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_30._M_refcount);
    in_RAX = extraout_RAX;
  }
  return in_RAX;
}

Assistant:

void Protocol::send(Packet::ptr packet, bool immediate /* = false */)
{
    if (!packet)
        return;

    Peer* peer = packet->m_peer;

    if (packet->has_flag(PacketFlag::RELIABLE)) {
        /* Assign a sequence number for this packet and track it.*/
        ProtocolChannel& chan = peer->m_channels[packet->get_channel()];
        packet->m_sequence_num = chan.next_sequence++;
        chan.sent_reliable.push_back(packet);
    }

    packet->m_rto = limit_rto(peer->get_rto());
    packet->m_send_queued = true;

    m_host->queue_outgoing_packet(packet, immediate);
}